

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O2

void __thiscall Steiner::solve(Steiner *this)

{
  int iVar1;
  int *piVar2;
  pointer pEVar3;
  Edge *e;
  pointer pEVar4;
  ostream *poVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  EVP_PKEY_CTX *ctx;
  uint iter;
  uint uVar9;
  reference rVar10;
  
  buildRSG(this);
  buildMST(this);
  if (gDoplot == true) {
    std::vector<Edge,_std::allocator<Edge>_>::operator=(&this->_init_edges,&this->_edges);
    std::vector<int,_std::allocator<int>_>::operator=(&this->_init_MST,&this->_MST);
  }
  pEVar4 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ctx = (EVP_PKEY_CTX *)this->_MST_cost;
  for (piVar6 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
    ctx = ctx + pEVar4[*piVar6].weight;
    this->_MST_cost = (longlong)ctx;
  }
  buildRST(this);
  uVar8 = 4;
  if (this->_init_p < 500) {
    uVar8 = 99 < this->_init_p | 2;
  }
  for (uVar9 = 1; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    init(this,ctx);
    buildRSG(this);
    buildMST(this);
    buildRST(this);
  }
  pEVar3 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = this->_MRST_cost;
  for (pEVar4 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar3; pEVar4 = pEVar4 + 1) {
    lVar7 = lVar7 + pEVar4->weight;
    this->_MRST_cost = lVar7;
  }
  piVar2 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
    iVar1 = *piVar6;
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_edges_del,(long)iVar1);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      this->_MRST_cost =
           this->_MRST_cost +
           (long)(this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1].weight;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cerr,"RSG edge   : ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cerr,"MST length : ");
  poVar5 = std::ostream::_M_insert<long_long>((longlong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cerr,"MRST length: ");
  poVar5 = std::ostream::_M_insert<long_long>((longlong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cerr,"Improvement: ");
  poVar5 = std::ostream::_M_insert<double>
                     (((double)(this->_MST_cost - this->_MRST_cost) / (double)this->_MST_cost) *
                      100.0);
  poVar5 = std::operator<<(poVar5,"%");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void Steiner::solve() {
#ifdef VERBOSE
  TimeUsage timer;
#endif
  buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    _init_edges = _edges;
    _init_MST = _MST;
  }
  for (int eId : _MST) _MST_cost += _edges[eId].weight;
  buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  unsigned numIter = 2;
  if (_init_p >= 10) numIter = 2;
  if (_init_p >= 100) numIter = 3;
  if (_init_p >= 500) numIter = 4;
  for (unsigned iter = 1; iter < numIter; ++iter) {
    init();
    buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  }
  for (auto& e : _newE) _MRST_cost += e.weight;
  for (int eId : _MST) {
    if (_edges_del[eId]) continue;
    _MRST_cost += _edges[eId].weight;
  }
  cerr << _name << endl;
  cerr << "RSG edge   : " << _edges.size() << endl;
  cerr << "MST length : " << _MST_cost << endl;
  cerr << "MRST length: " << _MRST_cost << endl;
  cerr << "Improvement: "
       << (double)(_MST_cost - _MRST_cost) / _MST_cost * 100
       << "%" << endl;
}